

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

void linenoiseEditDeletePrevWord(linenoiseState *l)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  sVar1 = l->pos;
  if (sVar1 != 0) {
    sVar3 = sVar1;
    do {
      if (l->buf[sVar3 - 1] != ' ') {
        pcVar2 = l->buf;
        goto LAB_0010b5df;
      }
      sVar3 = sVar3 - 1;
      l->pos = sVar3;
    } while (sVar3 != 0);
  }
  pcVar2 = l->buf;
  goto LAB_0010b5b2;
  while( true ) {
    sVar3 = sVar3 - 1;
    l->pos = sVar3;
    if (sVar3 == 0) break;
LAB_0010b5df:
    if (pcVar2[sVar3 - 1] == ' ') goto LAB_0010b5b5;
  }
LAB_0010b5b2:
  sVar3 = 0;
LAB_0010b5b5:
  memmove(pcVar2 + sVar3,pcVar2 + sVar1,(l->len - sVar1) + 1);
  l->len = l->len + (sVar3 - sVar1);
  linenoiseRefreshLine();
  return;
}

Assistant:

void linenoiseEditDeletePrevWord(struct linenoiseState *l) {
    size_t old_pos = l->pos;
    size_t diff;

    while (l->pos > 0 && l->buf[l->pos-1] == ' ')
        l->pos--;
    while (l->pos > 0 && l->buf[l->pos-1] != ' ')
        l->pos--;
    diff = old_pos - l->pos;
    memmove(l->buf+l->pos,l->buf+old_pos,l->len-old_pos+1);
    l->len -= diff;
    linenoiseRefreshLine();
}